

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

PropertyId __thiscall
Js::ParseableFunctionInfo::GetOrAddPropertyIdTracked
          (ParseableFunctionInfo *this,CharacterBuffer<char16_t> *propName)

{
  ScriptContext *this_00;
  bool bVar1;
  PropertyId propertyId_00;
  Utf8SourceInfo *this_01;
  BoundedPropertyRecordHashSet *this_02;
  PropertyId propertyId;
  ScriptContext *scriptContext;
  PropertyRecord *propRecord;
  CharacterBuffer<char16_t> *propName_local;
  ParseableFunctionInfo *this_local;
  
  scriptContext = (ScriptContext *)0x0;
  this_00 = (this->super_FunctionProxy).m_scriptContext;
  propRecord = (PropertyRecord *)propName;
  propName_local = (CharacterBuffer<char16_t> *)this;
  ScriptContext::GetOrAddPropertyRecord(this_00,propName,(PropertyRecord **)&scriptContext);
  propertyId_00 = PropertyRecord::GetPropertyId((PropertyRecord *)scriptContext);
  bVar1 = ScriptContext::IsTrackedPropertyId(this_00,propertyId_00);
  if (!bVar1) {
    this_01 = Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::operator->
                        (&(this->super_FunctionProxy).m_utf8SourceInfo);
    this_02 = Utf8SourceInfo::GetBoundedPropertyRecordHashSet(this_01);
    JsUtil::
    BaseHashSet<const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_const_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Item(this_02,(PropertyRecord **)&scriptContext);
  }
  return propertyId_00;
}

Assistant:

PropertyId
    ParseableFunctionInfo::GetOrAddPropertyIdTracked(JsUtil::CharacterBuffer<WCHAR> const& propName)
    {
        const Js::PropertyRecord* propRecord = nullptr;
        ScriptContext * scriptContext = this->m_scriptContext;
        scriptContext->GetOrAddPropertyRecord(propName, &propRecord);

        PropertyId propertyId = propRecord->GetPropertyId();
        if (!scriptContext->IsTrackedPropertyId(propertyId))
        {
            this->m_utf8SourceInfo->GetBoundedPropertyRecordHashSet()->Item(propRecord);
        }
        return propertyId;
    }